

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_trace_striped_sse2_128_32.c
# Opt level: O2

parasail_result_t *
parasail_sw_trace_striped_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined8 *puVar1;
  int *piVar2;
  uint *puVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  parasail_result_t *result;
  __m128i *palVar16;
  __m128i *ptr;
  __m128i *b;
  __m128i *palVar17;
  __m128i *ptr_00;
  long lVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  undefined8 uVar22;
  long lVar23;
  ulong uVar24;
  long lVar25;
  char *pcVar26;
  uint uVar27;
  int iVar28;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  ulong uVar29;
  __m128i *palVar30;
  char *__format;
  uint a;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  int *piVar34;
  __m128i *palVar35;
  long lVar36;
  long lVar37;
  ulong uVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  int iVar45;
  int iVar46;
  int iVar48;
  undefined1 auVar41 [16];
  int iVar47;
  int iVar49;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar57;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  uint uVar61;
  uint uVar62;
  uint uVar67;
  uint uVar69;
  undefined1 in_XMM12 [16];
  undefined1 auVar63 [16];
  uint uVar68;
  uint uVar70;
  uint uVar71;
  uint uVar72;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  uint local_120;
  uint local_10c;
  __m128i *local_108;
  ulong local_100;
  __m128i *local_f8;
  long local_c8;
  undefined1 local_58 [16];
  size_t len;
  
  local_100 = (ulong)(uint)s2Len;
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar26 = "profile";
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar26 = "profile->profile32.score";
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar26 = "profile->matrix";
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar26 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar26 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar26 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar26 = "open";
        }
        else {
          if (-1 < gap) {
            uVar38 = (ulong)uVar4 + 3 >> 2;
            iVar21 = ppVar6->max;
            uVar22 = 0x10;
            a = (uint)uVar38;
            result = parasail_result_new_trace(a,s2Len,0x10,0x10);
            if (result == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            result->flag = result->flag | 0x4480804;
            palVar16 = parasail_memalign___m128i(0x10,uVar38);
            ptr = parasail_memalign___m128i(0x10,uVar38);
            b = parasail_memalign___m128i(0x10,uVar38);
            local_f8 = parasail_memalign___m128i(0x10,uVar38);
            palVar17 = parasail_memalign___m128i(0x10,uVar38);
            ptr_00 = parasail_memalign___m128i(0x10,uVar38);
            local_108 = parasail_memalign___m128i(0x10,uVar38);
            auVar40._0_4_ = -(uint)((int)((ulong)palVar16 >> 0x20) == 0 && (int)palVar16 == 0);
            auVar40._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
            auVar40._8_4_ = -(uint)((int)b == 0 && (int)((ulong)b >> 0x20) == 0);
            auVar40._12_4_ = -(uint)((int)local_f8 == 0 && (int)((ulong)local_f8 >> 0x20) == 0);
            iVar19 = movmskps((int)uVar22,auVar40);
            len = CONCAT44((int)((ulong)uVar22 >> 0x20),iVar19);
            if (iVar19 != 0) {
              return (parasail_result_t *)0x0;
            }
            if (palVar17 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (local_108 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            c[1] = extraout_RDX;
            c[0] = uVar38;
            parasail_memset___m128i(palVar16,c,len);
            iVar19 = -open;
            c_00[1] = extraout_RDX_00;
            c_00[0] = uVar38;
            parasail_memset___m128i(b,c_00,len);
            c_01[1] = extraout_RDX_01;
            c_01[0] = uVar38;
            parasail_memset___m128i(local_f8,c_01,len);
            lVar18 = uVar38 * 0x10;
            for (lVar23 = 0; auVar15 = _DAT_008a3610, auVar14 = _DAT_008a3600,
                auVar13 = _DAT_008a35f0, auVar12 = _DAT_008a35e0, auVar40 = _DAT_008a35d0,
                lVar18 != lVar23; lVar23 = lVar23 + 0x10) {
              puVar1 = (undefined8 *)((long)((result->field_4).rowcols)->score_row + lVar23);
              *puVar1 = 0x800000008;
              puVar1[1] = 0x800000008;
            }
            uVar32 = 0;
            local_10c = 0xc0000000;
            local_58 = (undefined1  [16])0x0;
            auVar60 = (undefined1  [16])0x0;
            local_120 = 0;
            do {
              local_c8 = (uVar32 + 1) * lVar18;
              lVar23 = lVar18 * uVar32;
              palVar30 = palVar17;
              palVar35 = ptr;
              do {
                ptr = palVar16;
                uVar31 = uVar32;
                palVar17 = local_f8;
                local_f8 = palVar30;
                palVar30 = palVar17;
                if (uVar31 == (uint)s2Len) goto LAB_0060ed95;
                palVar30 = ptr + (a - 1);
                palVar16 = ptr + (a - 1);
                iVar33 = (int)(*palVar16)[0];
                iVar46 = *(int *)((long)*palVar16 + 4);
                iVar48 = (int)(*palVar16)[1];
                iVar28 = 0;
                iVar20 = ppVar6->mapper[(byte)s2[uVar31]] * a;
                uVar27 = (uint)uVar31 - 2;
                uVar29 = (ulong)uVar27;
                palVar16 = palVar35;
                if (local_120 == uVar27) {
                  palVar16 = local_108;
                }
                uVar32 = uVar31 + 1;
                uVar24 = 1;
                auVar51._4_4_ = -open;
                auVar51._0_4_ = -open;
                auVar51._8_4_ = -open;
                auVar51._12_4_ = -open;
                for (lVar36 = 0; lVar18 != lVar36; lVar36 = lVar36 + 0x10) {
                  piVar2 = (int *)((long)pvVar5 + lVar36 + (long)iVar20 * 0x10);
                  auVar74._0_4_ = iVar28 + *piVar2;
                  auVar74._4_4_ = iVar33 + piVar2[1];
                  auVar74._8_4_ = iVar46 + piVar2[2];
                  auVar74._12_4_ = iVar48 + piVar2[3];
                  auVar52 = *(undefined1 (*) [16])((long)*b + lVar36);
                  auVar63._0_4_ = -(uint)(0 < auVar74._0_4_);
                  auVar63._4_4_ = -(uint)(0 < auVar74._4_4_);
                  auVar63._8_4_ = -(uint)(0 < auVar74._8_4_);
                  auVar63._12_4_ = -(uint)(0 < auVar74._12_4_);
                  auVar63 = auVar63 & auVar74;
                  auVar73._0_4_ = -(uint)(auVar52._0_4_ < auVar63._0_4_);
                  auVar73._4_4_ = -(uint)(auVar52._4_4_ < auVar63._4_4_);
                  auVar73._8_4_ = -(uint)(auVar52._8_4_ < auVar63._8_4_);
                  auVar73._12_4_ = -(uint)(auVar52._12_4_ < auVar63._12_4_);
                  auVar74 = ~auVar73 & auVar52 | auVar63 & auVar73;
                  auVar80._0_4_ = -(uint)(auVar51._0_4_ < auVar74._0_4_);
                  auVar80._4_4_ = -(uint)(auVar51._4_4_ < auVar74._4_4_);
                  auVar80._8_4_ = -(uint)(auVar51._8_4_ < auVar74._8_4_);
                  auVar80._12_4_ = -(uint)(auVar51._12_4_ < auVar74._12_4_);
                  auVar74 = ~auVar80 & auVar51 | auVar74 & auVar80;
                  *(undefined1 (*) [16])((long)*palVar16 + lVar36) = auVar74;
                  iVar28 = auVar74._0_4_;
                  uVar61 = -(uint)(auVar63._0_4_ == iVar28);
                  iVar33 = auVar74._4_4_;
                  uVar67 = -(uint)(auVar63._4_4_ == iVar33);
                  iVar46 = auVar74._8_4_;
                  uVar69 = -(uint)(auVar63._8_4_ == iVar46);
                  iVar48 = auVar74._12_4_;
                  uVar71 = -(uint)(auVar63._12_4_ == iVar48);
                  uVar62 = ~uVar61 & auVar80._0_4_ + auVar15._0_4_ |
                           ~-(uint)(iVar28 == 0) & uVar61 & 4;
                  uVar68 = ~uVar67 & auVar80._4_4_ + auVar15._4_4_ |
                           ~-(uint)(iVar33 == 0) & uVar67 & 4;
                  uVar70 = ~uVar69 & auVar80._8_4_ + auVar15._8_4_ |
                           ~-(uint)(iVar46 == 0) & uVar69 & 4;
                  uVar72 = ~uVar71 & auVar80._12_4_ + auVar15._12_4_ |
                           ~-(uint)(iVar48 == 0) & uVar71 & 4;
                  puVar3 = (uint *)((long)((result->field_4).rowcols)->score_row + lVar36 + lVar23);
                  uVar61 = *puVar3;
                  uVar67 = puVar3[1];
                  uVar69 = puVar3[2];
                  uVar71 = puVar3[3];
                  puVar3 = (uint *)((long)*ptr_00 + lVar36);
                  *puVar3 = uVar62;
                  puVar3[1] = uVar68;
                  puVar3[2] = uVar70;
                  puVar3[3] = uVar72;
                  puVar3 = (uint *)((long)((result->field_4).rowcols)->score_row + lVar36 + lVar23);
                  *puVar3 = uVar61 | uVar62;
                  puVar3[1] = uVar67 | uVar68;
                  puVar3[2] = uVar69 | uVar70;
                  puVar3[3] = uVar71 | uVar72;
                  in_XMM6._0_4_ = iVar28 - open;
                  in_XMM6._4_4_ = iVar33 - open;
                  in_XMM6._8_4_ = iVar46 - open;
                  in_XMM6._12_4_ = iVar48 - open;
                  auVar78._0_4_ = auVar52._0_4_ - gap;
                  auVar78._4_4_ = auVar52._4_4_ - gap;
                  auVar78._8_4_ = auVar52._8_4_ - gap;
                  auVar78._12_4_ = auVar52._12_4_ - gap;
                  auVar52._0_4_ = -(uint)(auVar78._0_4_ < in_XMM6._0_4_);
                  auVar52._4_4_ = -(uint)(auVar78._4_4_ < in_XMM6._4_4_);
                  auVar52._8_4_ = -(uint)(auVar78._8_4_ < in_XMM6._8_4_);
                  auVar52._12_4_ = -(uint)(auVar78._12_4_ < in_XMM6._12_4_);
                  *(undefined1 (*) [16])((long)*b + lVar36) = ~auVar52 & auVar78 | in_XMM6 & auVar52
                  ;
                  piVar2 = (int *)((long)*palVar17 + lVar36);
                  auVar64._0_4_ = *piVar2 - gap;
                  auVar64._4_4_ = piVar2[1] - gap;
                  auVar64._8_4_ = piVar2[2] - gap;
                  auVar64._12_4_ = piVar2[3] - gap;
                  auVar75._0_4_ = -(uint)(auVar64._0_4_ < in_XMM6._0_4_);
                  auVar75._4_4_ = -(uint)(auVar64._4_4_ < in_XMM6._4_4_);
                  auVar75._8_4_ = -(uint)(auVar64._8_4_ < in_XMM6._8_4_);
                  auVar75._12_4_ = -(uint)(auVar64._12_4_ < in_XMM6._12_4_);
                  *(undefined1 (*) [16])((long)*local_f8 + lVar36) =
                       ~auVar75 & auVar64 | in_XMM6 & auVar75;
                  if ((int)uVar32 < s2Len) {
                    *(undefined1 (*) [16])
                     ((long)((result->field_4).rowcols)->score_row + lVar36 + local_c8) =
                         auVar75 & auVar40 ^ auVar12;
                  }
                  in_XMM12._0_4_ = auVar51._0_4_ - gap;
                  in_XMM12._4_4_ = auVar51._4_4_ - gap;
                  in_XMM12._8_4_ = auVar51._8_4_ - gap;
                  in_XMM12._12_4_ = auVar51._12_4_ - gap;
                  auVar50._0_4_ = -(uint)(in_XMM12._0_4_ < in_XMM6._0_4_);
                  auVar50._4_4_ = -(uint)(in_XMM12._4_4_ < in_XMM6._4_4_);
                  auVar50._8_4_ = -(uint)(in_XMM12._8_4_ < in_XMM6._8_4_);
                  auVar50._12_4_ = -(uint)(in_XMM12._12_4_ < in_XMM6._12_4_);
                  if (uVar24 < uVar38) {
                    piVar2 = ((result->field_4).rowcols)->score_row;
                    *(undefined1 (*) [16])((long)piVar2 + lVar36 + 0x10 + lVar23) =
                         auVar50 & auVar13 ^ auVar14 |
                         *(undefined1 (*) [16])((long)piVar2 + lVar36 + 0x10 + lVar23);
                  }
                  auVar76._0_4_ = -(uint)(auVar60._0_4_ < iVar28);
                  auVar76._4_4_ = -(uint)(auVar60._4_4_ < iVar33);
                  auVar76._8_4_ = -(uint)(auVar60._8_4_ < iVar46);
                  auVar76._12_4_ = -(uint)(auVar60._12_4_ < iVar48);
                  auVar60 = ~auVar76 & auVar60 | auVar74 & auVar76;
                  auVar51 = ~auVar50 & in_XMM12 | in_XMM6 & auVar50;
                  piVar2 = (int *)((long)*ptr + lVar36);
                  iVar28 = *piVar2;
                  iVar33 = piVar2[1];
                  iVar46 = piVar2[2];
                  iVar48 = piVar2[3];
                  uVar24 = uVar24 + 1;
                }
                if (local_120 == uVar27) {
                  local_108 = palVar35;
                }
                auVar43 = auVar51;
                auVar82 = in_XMM12;
                for (iVar28 = 0; iVar28 != 4; iVar28 = iVar28 + 1) {
                  iVar46 = (int)(*palVar30)[0];
                  iVar48 = *(int *)((long)*palVar30 + 4);
                  iVar57 = (int)(*palVar30)[1];
                  iVar33 = 0;
                  auVar7._4_8_ = in_XMM6._8_8_;
                  auVar7._0_4_ = in_XMM6._0_4_;
                  auVar58._0_8_ = auVar7._0_8_ << 0x20;
                  auVar58._8_4_ = in_XMM6._4_4_;
                  auVar58._12_4_ = in_XMM6._8_4_;
                  in_XMM6._4_12_ = auVar58._4_12_;
                  in_XMM6._0_4_ = iVar19;
                  auVar8._4_8_ = auVar82._8_8_;
                  auVar8._0_4_ = auVar82._0_4_;
                  auVar81._0_8_ = auVar8._0_8_ << 0x20;
                  auVar81._8_4_ = auVar82._4_4_;
                  auVar81._12_4_ = auVar82._8_4_;
                  auVar82._4_12_ = auVar81._4_12_;
                  auVar82._0_4_ = 0xc0000000;
                  auVar9._4_8_ = auVar51._8_8_;
                  auVar9._0_4_ = auVar51._0_4_;
                  auVar41._0_8_ = auVar9._0_8_ << 0x20;
                  auVar41._8_4_ = auVar51._4_4_;
                  auVar41._12_4_ = auVar51._8_4_;
                  auVar51._4_12_ = auVar41._4_12_;
                  auVar51._0_4_ = iVar19;
                  auVar10._4_8_ = in_XMM12._8_8_;
                  auVar10._0_4_ = in_XMM12._0_4_;
                  auVar65._0_8_ = auVar10._0_8_ << 0x20;
                  auVar65._8_4_ = in_XMM12._4_4_;
                  auVar65._12_4_ = in_XMM12._8_4_;
                  in_XMM12._4_12_ = auVar65._4_12_;
                  in_XMM12._0_4_ = 0xc0000000;
                  auVar11._4_8_ = auVar43._8_8_;
                  auVar11._0_4_ = auVar43._0_4_;
                  auVar79._0_8_ = auVar11._0_8_ << 0x20;
                  auVar79._8_4_ = auVar43._4_4_;
                  auVar79._12_4_ = auVar43._8_4_;
                  auVar43._4_12_ = auVar79._4_12_;
                  auVar43._0_4_ = iVar19;
                  lVar25 = 0;
                  uVar29 = uVar38;
                  lVar36 = local_c8;
                  lVar37 = lVar23;
                  while (bVar39 = uVar29 != 0, uVar29 = uVar29 - 1, bVar39) {
                    auVar52 = *(undefined1 (*) [16])((long)*palVar16 + lVar25);
                    auVar83._0_4_ = -(uint)(auVar51._0_4_ < auVar52._0_4_);
                    iVar45 = auVar51._4_4_;
                    auVar83._4_4_ = -(uint)(iVar45 < auVar52._4_4_);
                    iVar47 = auVar51._8_4_;
                    auVar83._8_4_ = -(uint)(iVar47 < auVar52._8_4_);
                    iVar49 = auVar51._12_4_;
                    auVar83._12_4_ = -(uint)(iVar49 < auVar52._12_4_);
                    auVar74 = ~auVar83 & auVar51 | auVar52 & auVar83;
                    *(undefined1 (*) [16])((long)*palVar16 + lVar25) = auVar74;
                    piVar2 = (int *)((long)pvVar5 + lVar25 + (long)iVar20 * 0x10);
                    uVar27 = auVar74._0_4_;
                    auVar77._0_4_ =
                         -(uint)((-(uint)(0 < iVar33 + *piVar2) & iVar33 + *piVar2) == uVar27);
                    uVar61 = auVar74._4_4_;
                    auVar77._4_4_ =
                         -(uint)((-(uint)(0 < iVar46 + piVar2[1]) & iVar46 + piVar2[1]) == uVar61);
                    uVar67 = auVar74._8_4_;
                    auVar77._8_4_ =
                         -(uint)((-(uint)(0 < iVar48 + piVar2[2]) & iVar48 + piVar2[2]) == uVar67);
                    uVar69 = auVar74._12_4_;
                    auVar77._12_4_ =
                         -(uint)((-(uint)(0 < iVar57 + piVar2[3]) & iVar57 + piVar2[3]) == uVar69);
                    auVar52 = *(undefined1 (*) [16])
                               ((long)((result->field_4).rowcols)->score_row + lVar37) &
                              _DAT_008a3990;
                    auVar78 = ~(auVar77 | auVar83) & auVar15 |
                              *(undefined1 (*) [16])((long)*ptr_00 + lVar25) & (auVar77 | auVar83);
                    *(undefined1 (*) [16])((long)*ptr_00 + lVar25) = auVar78;
                    *(undefined1 (*) [16])((long)((result->field_4).rowcols)->score_row + lVar37) =
                         auVar78 | auVar52;
                    piVar34 = ((result->field_4).rowcols)->score_row;
                    auVar59._0_4_ = -(uint)(in_XMM12._0_4_ < in_XMM6._0_4_);
                    auVar59._4_4_ = -(uint)(in_XMM12._4_4_ < in_XMM6._4_4_);
                    auVar59._8_4_ = -(uint)(in_XMM12._8_4_ < in_XMM6._8_4_);
                    auVar59._12_4_ = -(uint)(in_XMM12._12_4_ < in_XMM6._12_4_);
                    *(undefined1 (*) [16])((long)piVar34 + lVar37) =
                         (*(undefined1 (*) [16])((long)piVar34 + lVar37) & _DAT_008a39a0 |
                         auVar59 & auVar13) ^ auVar14;
                    in_XMM6._0_4_ = uVar27 - open;
                    in_XMM6._4_4_ = uVar61 - open;
                    in_XMM6._8_4_ = uVar67 - open;
                    in_XMM6._12_4_ = uVar69 - open;
                    piVar2 = (int *)((long)*palVar17 + lVar25);
                    auVar66._0_4_ = *piVar2 - gap;
                    auVar66._4_4_ = piVar2[1] - gap;
                    auVar66._8_4_ = piVar2[2] - gap;
                    auVar66._12_4_ = piVar2[3] - gap;
                    auVar53._0_4_ = -(uint)(auVar66._0_4_ < in_XMM6._0_4_);
                    auVar53._4_4_ = -(uint)(auVar66._4_4_ < in_XMM6._4_4_);
                    auVar53._8_4_ = -(uint)(auVar66._8_4_ < in_XMM6._8_4_);
                    auVar53._12_4_ = -(uint)(auVar66._12_4_ < in_XMM6._12_4_);
                    *(undefined1 (*) [16])((long)*local_f8 + lVar25) =
                         ~auVar53 & auVar66 | in_XMM6 & auVar53;
                    if ((int)uVar32 < s2Len) {
                      piVar34 = ((result->field_4).rowcols)->score_row;
                      *(undefined1 (*) [16])((long)piVar34 + lVar36) = auVar53 & auVar40 ^ auVar12;
                    }
                    auVar54._0_4_ = -(uint)(auVar60._0_4_ < (int)uVar27);
                    auVar54._4_4_ = -(uint)(auVar60._4_4_ < (int)uVar61);
                    auVar54._8_4_ = -(uint)(auVar60._8_4_ < (int)uVar67);
                    auVar54._12_4_ = -(uint)(auVar60._12_4_ < (int)uVar69);
                    auVar60 = ~auVar54 & auVar60 | auVar74 & auVar54;
                    auVar51._0_4_ = auVar51._0_4_ - gap;
                    auVar51._4_4_ = iVar45 - gap;
                    auVar51._8_4_ = iVar47 - gap;
                    auVar51._12_4_ = iVar49 - gap;
                    auVar55._0_4_ = -(uint)(auVar51._0_4_ < in_XMM6._0_4_);
                    auVar55._4_4_ = -(uint)(auVar51._4_4_ < in_XMM6._4_4_);
                    auVar55._8_4_ = -(uint)(auVar51._8_4_ < in_XMM6._8_4_);
                    auVar55._12_4_ = -(uint)(auVar51._12_4_ < in_XMM6._12_4_);
                    iVar33 = movmskps((int)piVar34,auVar55);
                    auVar82 = auVar51;
                    if (iVar33 == 0xf) goto LAB_0060eceb;
                    in_XMM12._0_4_ = auVar43._0_4_ - gap;
                    in_XMM12._4_4_ = auVar43._4_4_ - gap;
                    in_XMM12._8_4_ = auVar43._8_4_ - gap;
                    in_XMM12._12_4_ = auVar43._12_4_ - gap;
                    auVar42._0_4_ = -(uint)(in_XMM12._0_4_ < in_XMM6._0_4_);
                    auVar42._4_4_ = -(uint)(in_XMM12._4_4_ < in_XMM6._4_4_);
                    auVar42._8_4_ = -(uint)(in_XMM12._8_4_ < in_XMM6._8_4_);
                    auVar42._12_4_ = -(uint)(in_XMM12._12_4_ < in_XMM6._12_4_);
                    auVar43 = ~auVar42 & in_XMM12 | in_XMM6 & auVar42;
                    piVar2 = (int *)((long)*ptr + lVar25);
                    iVar33 = *piVar2;
                    iVar46 = piVar2[1];
                    iVar48 = piVar2[2];
                    iVar57 = piVar2[3];
                    lVar36 = lVar36 + 0x10;
                    lVar37 = lVar37 + 0x10;
                    lVar25 = lVar25 + 0x10;
                  }
                }
LAB_0060eceb:
                in_XMM12 = auVar82;
                auVar44._0_4_ = -(uint)((int)local_58._0_4_ < auVar60._0_4_);
                auVar44._4_4_ = -(uint)((int)local_58._4_4_ < auVar60._4_4_);
                iVar33 = auVar60._8_4_;
                iVar46 = auVar60._12_4_;
                auVar44._8_4_ = -(uint)((int)local_58._8_4_ < iVar33);
                auVar44._12_4_ = -(uint)((int)local_58._12_4_ < iVar46);
                iVar28 = movmskps((int)uVar29,auVar44);
                local_c8 = local_c8 + lVar18;
                lVar23 = lVar23 + lVar18;
                palVar30 = palVar17;
                palVar35 = ptr;
              } while (iVar28 == 0);
              auVar56._0_4_ = -(uint)(iVar33 < auVar60._0_4_);
              auVar56._4_4_ = -(uint)(iVar46 < auVar60._4_4_);
              auVar56._8_4_ = -(uint)(0 < iVar33);
              auVar56._12_4_ = -(uint)(0 < iVar46);
              auVar51 = ~auVar56 & auVar60 >> 0x40 | auVar60 & auVar56;
              uVar27 = auVar51._0_4_;
              uVar67 = auVar51._4_4_;
              uVar61 = -(uint)((int)uVar67 < (int)uVar27);
              local_10c = ~uVar61 & uVar67 | uVar27 & uVar61;
              if (0x7ffffffe - iVar21 < (int)local_10c) {
                *(byte *)&result->flag = (byte)result->flag | 0x40;
                palVar30 = local_f8;
                ptr = palVar16;
                local_100 = uVar31;
                local_f8 = palVar17;
LAB_0060ed95:
                if (local_10c == 0x7fffffff) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar19 = parasail_result_is_saturated(result);
                iVar21 = 0;
                palVar16 = local_108;
                palVar17 = palVar35;
                if (iVar19 == 0) {
                  uVar27 = (int)local_100 - 1;
                  if (local_120 == (int)local_100 - 2U) {
                    palVar17 = local_108;
                    palVar16 = palVar35;
                  }
                  if (local_120 == uVar27) {
                    palVar17 = palVar35;
                    palVar16 = ptr;
                  }
                  iVar21 = uVar4 - 1;
                  for (uVar38 = 0; (a & 0x1fffffff) << 2 != (uint)uVar38; uVar38 = uVar38 + 1) {
                    if ((*(uint *)((long)*palVar16 + uVar38 * 4) == local_10c) &&
                       (iVar19 = ((uint)uVar38 & 3) * a + ((uint)(uVar38 >> 2) & 0x3fffffff),
                       iVar19 < iVar21)) {
                      iVar21 = iVar19;
                    }
                  }
                  if (local_120 == uVar27) {
                    ptr = local_108;
                  }
                }
                else {
                  local_10c = 0;
                  local_120 = 0;
                }
                result->score = local_10c;
                result->end_query = iVar21;
                result->end_ref = local_120;
                parasail_free(palVar16);
                parasail_free(ptr_00);
                parasail_free(local_f8);
                parasail_free(palVar30);
                parasail_free(b);
                parasail_free(palVar17);
                parasail_free(ptr);
                return result;
              }
              local_58._4_4_ = local_10c;
              local_58._0_4_ = local_10c;
              local_58._8_4_ = local_10c;
              local_58._12_4_ = local_10c;
              local_120 = (uint)uVar31;
            } while( true );
          }
          __format = "%s: %s must be >= 0\n";
          pcVar26 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_trace_striped_profile_sse2_128_32",pcVar26);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEaStore = NULL;
    __m128i* restrict pvEaLoad = NULL;
    __m128i* restrict pvHT = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    int32_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int32_t maxp = 0;
    parasail_result_t *result = NULL;
    __m128i vTZero;
    __m128i vTIns;
    __m128i vTDel;
    __m128i vTDiag;
    __m128i vTDiagE;
    __m128i vTInsE;
    __m128i vTDiagF;
    __m128i vTDelF;
    __m128i vTMask;
    __m128i vFTMask;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    vZero = _mm_setzero_si128();
    score = NEG_INF;
    vMaxH = vZero;
    vMaxHUnit = vZero;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    vTZero = _mm_set1_epi32(PARASAIL_ZERO);
    vTIns  = _mm_set1_epi32(PARASAIL_INS);
    vTDel  = _mm_set1_epi32(PARASAIL_DEL);
    vTDiag = _mm_set1_epi32(PARASAIL_DIAG);
    vTDiagE= _mm_set1_epi32(PARASAIL_DIAG_E);
    vTInsE = _mm_set1_epi32(PARASAIL_INS_E);
    vTDiagF= _mm_set1_epi32(PARASAIL_DIAG_F);
    vTDelF = _mm_set1_epi32(PARASAIL_DEL_F);
    vTMask = _mm_set1_epi32(PARASAIL_ZERO_MASK);
    vFTMask= _mm_set1_epi32(PARASAIL_F_MASK);

    /* initialize result */
    result = parasail_result_new_trace(segLen, s2Len, 16, sizeof(__m128i));
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_TRACE
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);
    pvEaStore = parasail_memalign___m128i(16, segLen);
    pvEaLoad = parasail_memalign___m128i(16, segLen);
    pvHT = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!pvEaStore) return NULL;
    if (!pvEaLoad) return NULL;
    if (!pvHT) return NULL;
    if (!pvHMax) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi32(-open), segLen);
    parasail_memset___m128i(pvEaStore, _mm_set1_epi32(-open), segLen);

    for (i=0; i<segLen; ++i) {
        arr_store(result->trace->trace_table, vTDiagE, i, segLen, 0);
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vEF_opn;
        __m128i vE;
        __m128i vE_ext;
        __m128i vF;
        __m128i vF_ext;
        __m128i vFa;
        __m128i vFa_ext;
        __m128i vH;
        __m128i vH_dag;
        const __m128i* vP = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = _mm_sub_epi32(vZero,vGapO);

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            SWAP3(pvHMax,  pvHLoad,  pvHStore)
            SWAP(pvEaLoad,  pvEaStore)
        }
        else {
            /* Swap the 2 H buffers. */
            SWAP(pvHLoad,  pvHStore)
            SWAP(pvEaLoad,  pvEaStore)
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH_dag = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vH_dag = _mm_max_epi32_rpl(vH_dag, vZero);
            vH = _mm_max_epi32_rpl(vH_dag, vE);
            vH = _mm_max_epi32_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);

            {
                __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                __m128i cond_zero = _mm_cmpeq_epi32(vH, vZero);
                __m128i case1 = _mm_cmpeq_epi32(vH, vH_dag);
                __m128i case2 = _mm_cmpeq_epi32(vH, vF);
                __m128i vT = _mm_blendv_epi8_rpl(
                        _mm_blendv_epi8_rpl(vTIns, vTDel, case2),
                        _mm_blendv_epi8_rpl(vTDiag, vTZero, cond_zero),
                        case1);
                _mm_store_si128(pvHT + i, vT);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i, segLen, j);
            }
            vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
            vEF_opn = _mm_sub_epi32(vH, vGapO);

            /* Update vE value. */
            vE_ext = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32_rpl(vEF_opn, vE_ext);
            _mm_store_si128(pvE + i, vE);
            {
                __m128i vEa = _mm_load_si128(pvEaLoad + i);
                __m128i vEa_ext = _mm_sub_epi32(vEa, vGapE);
                vEa = _mm_max_epi32_rpl(vEF_opn, vEa_ext);
                _mm_store_si128(pvEaStore + i, vEa);
                if (j+1<s2Len) {
                    __m128i cond = _mm_cmpgt_epi32(vEF_opn, vEa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                    arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                }
            }

            /* Update vF value. */
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32_rpl(vEF_opn, vF_ext);
            if (i+1<segLen) {
                __m128i vTAll = arr_load(result->trace->trace_table, i+1, segLen, j);
                __m128i cond = _mm_cmpgt_epi32(vEF_opn, vF_ext);
                __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                vT = _mm_or_si128(vT, vTAll);
                arr_store(result->trace->trace_table, vT, i+1, segLen, j);
            }

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        vFa_ext = vF_ext;
        vFa = vF;
        for (k=0; k<segWidth; ++k) {
            __m128i vHp = _mm_load_si128(&pvHLoad[segLen - 1]);
            vHp = _mm_slli_si128(vHp, 4);
            vEF_opn = _mm_slli_si128(vEF_opn, 4);
            vEF_opn = _mm_insert_epi32_rpl(vEF_opn, -open, 0);
            vF_ext = _mm_slli_si128(vF_ext, 4);
            vF_ext = _mm_insert_epi32_rpl(vF_ext, NEG_INF, 0);
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32_rpl(vF, -open, 0);
            vFa_ext = _mm_slli_si128(vFa_ext, 4);
            vFa_ext = _mm_insert_epi32_rpl(vFa_ext, NEG_INF, 0);
            vFa = _mm_slli_si128(vFa, 4);
            vFa = _mm_insert_epi32_rpl(vFa, -open, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                {
                    __m128i vTAll;
                    __m128i vT;
                    __m128i case1;
                    __m128i case2;
                    __m128i cond;
                    vHp = _mm_add_epi32(vHp, _mm_load_si128(vP + i));
                    vHp = _mm_max_epi32_rpl(vHp, vZero);
                    case1 = _mm_cmpeq_epi32(vH, vHp);
                    case2 = _mm_cmpeq_epi32(vH, vF);
                    cond = _mm_andnot_si128(case1,case2);
                    vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    vT = _mm_load_si128(pvHT + i);
                    vT = _mm_blendv_epi8_rpl(vT, vTDel, cond);
                    _mm_store_si128(pvHT + i, vT);
                    vTAll = _mm_and_si128(vTAll, vTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vMaxH = _mm_max_epi32_rpl(vH, vMaxH);
                /* Update vF value. */
                {
                    __m128i vTAll = arr_load(result->trace->trace_table, i, segLen, j);
                    __m128i cond = _mm_cmpgt_epi32(vEF_opn, vFa_ext);
                    __m128i vT = _mm_blendv_epi8_rpl(vTDelF, vTDiagF, cond);
                    vTAll = _mm_and_si128(vTAll, vFTMask);
                    vTAll = _mm_or_si128(vTAll, vT);
                    arr_store(result->trace->trace_table, vTAll, i, segLen, j);
                }
                vEF_opn = _mm_sub_epi32(vH, vGapO);
                vF_ext = _mm_sub_epi32(vF, vGapE);
                {
                    __m128i vEa = _mm_load_si128(pvEaLoad + i);
                    __m128i vEa_ext = _mm_sub_epi32(vEa, vGapE);
                    vEa = _mm_max_epi32_rpl(vEF_opn, vEa_ext);
                    _mm_store_si128(pvEaStore + i, vEa);
                    if (j+1<s2Len) {
                        __m128i cond = _mm_cmpgt_epi32(vEF_opn, vEa_ext);
                        __m128i vT = _mm_blendv_epi8_rpl(vTInsE, vTDiagE, cond);
                        arr_store(result->trace->trace_table, vT, i, segLen, j+1);
                    }
                }
                if (! _mm_movemask_epi8(
                            _mm_or_si128(
                                _mm_cmpgt_epi32(vF_ext, vEF_opn),
                                _mm_cmpeq_epi32(vF_ext, vEF_opn))))
                    goto end;
                /*vF = _mm_max_epi32_rpl(vEF_opn, vF_ext);*/
                vF = vF_ext;
                vFa_ext = _mm_sub_epi32(vFa, vGapE);
                vFa = _mm_max_epi32_rpl(vEF_opn, vFa_ext);
                vHp = _mm_load_si128(pvHLoad + i);
            }
        }
end:
        {
        }

        {
            __m128i vCompare = _mm_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = 0;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            SWAP(pvHMax,  pvHStore)
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            SWAP(pvHMax,  pvHLoad)
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvHMax);
    parasail_free(pvHT);
    parasail_free(pvEaLoad);
    parasail_free(pvEaStore);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}